

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  ulong uVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  lua_Integer lVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  char *__s;
  lua_Integer n;
  ulong uVar10;
  ulong uVar11;
  char *__s2;
  size_t lp;
  size_t ls;
  MatchState ms;
  ulong local_270;
  char *local_268;
  ulong local_260;
  MatchState local_258;
  
  pcVar5 = luaL_checklstring(L,1,&local_260);
  local_268 = luaL_checklstring(L,2,&local_270);
  lVar6 = luaL_optinteger(L,3,1);
  n = lVar6;
  if ((lVar6 < 1) &&
     (n = 1, SBORROW8(lVar6,-local_260) == (long)(lVar6 + local_260) < 0 && lVar6 != 0)) {
    n = lVar6 + local_260 + 1;
  }
  uVar1 = n - 1;
  if (uVar1 <= local_260) {
    uVar10 = local_270;
    if (find == 0) {
LAB_00121d37:
      cVar2 = *local_268;
      pcVar9 = local_268;
      if (cVar2 == '^') {
        pcVar9 = local_268 + 1;
        uVar10 = uVar10 - 1;
        local_270 = uVar10;
      }
      local_258.matchdepth = 200;
      local_258.src_end = pcVar5 + local_260;
      local_258.p_end = pcVar9 + uVar10;
      local_258.src_init = pcVar5;
      local_258.L = L;
      do {
        lVar3 = n + -1;
        local_258.level = '\0';
        pcVar7 = match(&local_258,pcVar5 + lVar3,pcVar9);
        if (pcVar7 != (char *)0x0) {
          if (find != 0) {
            lua_pushinteger(L,n);
            lua_pushinteger(L,(long)pcVar7 - (long)pcVar5);
            iVar4 = push_captures(&local_258,(char *)0x0,(char *)0x0);
            return iVar4 + 2;
          }
          iVar4 = push_captures(&local_258,pcVar5 + n + -1,pcVar7);
          return iVar4;
        }
      } while ((cVar2 != '^') && (n = n + 1, pcVar5 + lVar3 < local_258.src_end));
    }
    else {
      iVar4 = lua_toboolean(L,4);
      uVar10 = local_270;
      if (iVar4 == 0) {
        uVar11 = 0;
        do {
          pcVar9 = local_268 + uVar11;
          pcVar7 = strpbrk(pcVar9,"^$*+?.([%-");
          if (pcVar7 != (char *)0x0) goto LAB_00121d37;
          sVar8 = strlen(pcVar9);
          uVar11 = uVar11 + sVar8 + 1;
        } while (uVar11 <= uVar10);
      }
      pcVar9 = pcVar5 + uVar1;
      if (uVar10 == 0) {
        if (pcVar5 != (char *)0x0) {
LAB_00121e24:
          lua_pushinteger(L,(lua_Integer)(pcVar9 + (1 - (long)pcVar5)));
          lua_pushinteger(L,(lua_Integer)(pcVar9 + (local_270 - (long)pcVar5)));
          return 2;
        }
      }
      else if (uVar10 <= local_260 - uVar1) {
        pcVar7 = (char *)((local_260 - uVar1) - (uVar10 - 1));
        if (pcVar7 != (char *)0x0) {
          cVar2 = *local_268;
          __s2 = local_268 + 1;
          __s = pcVar9;
          do {
            pcVar9 = (char *)memchr(__s,(int)cVar2,(size_t)pcVar7);
            if (pcVar9 == (char *)0x0) break;
            __s1 = pcVar9 + 1;
            iVar4 = bcmp(__s1,__s2,uVar10 - 1);
            if (iVar4 == 0) goto LAB_00121e24;
            pcVar7 = __s + ((long)pcVar7 - (long)__s1);
            __s = __s1;
          } while (pcVar7 != (char *)0x0);
        }
      }
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelatI(luaL_optinteger(L, 3, 1), ls) - 1;
  if (init > ls) {  /* start after string's end? */
    luaL_pushfail(L);  /* cannot find anything */
    return 1;
  }
  /* explicit request or no special characters? */
  if (find && (lua_toboolean(L, 4) || nospecials(p, lp))) {
    /* do a plain search */
    const char *s2 = lmemfind(s + init, ls - init, p, lp);
    if (s2) {
      lua_pushinteger(L, (s2 - s) + 1);
      lua_pushinteger(L, (s2 - s) + lp);
      return 2;
    }
  }
  else {
    MatchState ms;
    const char *s1 = s + init;
    int anchor = (*p == '^');
    if (anchor) {
      p++; lp--;  /* skip anchor character */
    }
    prepstate(&ms, L, s, ls, p, lp);
    do {
      const char *res;
      reprepstate(&ms);
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, (s1 - s) + 1);  /* start */
          lua_pushinteger(L, res - s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  luaL_pushfail(L);  /* not found */
  return 1;
}